

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  uint uVar1;
  u32 uVar2;
  sqlite3_module **ppsVar3;
  JsonNode *pUp;
  u32 iUp;
  JsonEachCursor *p;
  sqlite3_vtab_cursor *cur_local;
  
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    if (*(char *)&cur[3].pVtab == '\x06') {
      uVar2 = jsonNodeSize((JsonNode *)
                           (&(cur[7].pVtab)->pModule + (ulong)*(uint *)&cur[2].pVtab * 2));
      *(u32 *)&cur[2].pVtab = uVar2 + *(int *)&cur[2].pVtab;
      *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
    }
    else if (*(char *)&cur[3].pVtab == '\a') {
      uVar2 = jsonNodeSize((JsonNode *)
                           (&(cur[7].pVtab)->pModule + (ulong)(*(int *)&cur[2].pVtab + 1) * 2));
      *(u32 *)&cur[2].pVtab = uVar2 + 1 + *(int *)&cur[2].pVtab;
      *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
    }
    else {
      *(undefined4 *)&cur[2].pVtab = *(undefined4 *)((long)&cur[2].pVtab + 4);
    }
  }
  else {
    if ((*(byte *)((long)&(cur[7].pVtab)->pModule + (ulong)*(uint *)&cur[2].pVtab * 0x10 + 1) & 0x40
        ) != 0) {
      *(int *)&cur[2].pVtab = *(int *)&cur[2].pVtab + 1;
    }
    *(int *)&cur[2].pVtab = *(int *)&cur[2].pVtab + 1;
    *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
    if (*(uint *)&cur[2].pVtab < *(uint *)((long)&cur[2].pVtab + 4)) {
      uVar1 = *(uint *)((long)&(cur[9].pVtab)->pModule + (ulong)*(uint *)&cur[2].pVtab * 4);
      ppsVar3 = &(cur[7].pVtab)->pModule + (ulong)uVar1 * 2;
      *(char *)&cur[3].pVtab = *(char *)ppsVar3;
      if (*(char *)ppsVar3 == '\x06') {
        if (uVar1 == *(int *)&cur[2].pVtab - 1U) {
          *(int *)(ppsVar3 + 1) = 0;
        }
        else {
          *(int *)(ppsVar3 + 1) = *(int *)(ppsVar3 + 1) + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  if( p->bRecursive ){
    if( p->sParse.aNode[p->i].jnFlags & JNODE_LABEL ) p->i++;
    p->i++;
    p->iRowid++;
    if( p->i<p->iEnd ){
      u32 iUp = p->sParse.aUp[p->i];
      JsonNode *pUp = &p->sParse.aNode[iUp];
      p->eType = pUp->eType;
      if( pUp->eType==JSON_ARRAY ){
        assert( pUp->eU==0 || pUp->eU==3 );
        testcase( pUp->eU==3 );
        VVA( pUp->eU = 3 );
        if( iUp==p->i-1 ){
          pUp->u.iKey = 0;
        }else{
          pUp->u.iKey++;
        }
      }
    }
  }else{
    switch( p->eType ){
      case JSON_ARRAY: {
        p->i += jsonNodeSize(&p->sParse.aNode[p->i]);
        p->iRowid++;
        break;
      }
      case JSON_OBJECT: {
        p->i += 1 + jsonNodeSize(&p->sParse.aNode[p->i+1]);
        p->iRowid++;
        break;
      }
      default: {
        p->i = p->iEnd;
        break;
      }
    }
  }
  return SQLITE_OK;
}